

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
Catch::Detail::makeEnumInfo
          (StringRef enumName,StringRef allValueNames,vector<int,_std::allocator<int>_> *values)

{
  int *piVar1;
  StringRef enums;
  size_type *psVar2;
  const_iterator __begin2;
  int *piVar3;
  long lVar4;
  long *in_R9;
  int value;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> valueNames;
  int local_64;
  _Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>
  local_60;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> local_58;
  char *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_40 = (char *)allValueNames.m_size;
  local_38 = values;
  psVar2 = (size_type *)operator_new(0x28);
  psVar2[2] = 0;
  psVar2[3] = 0;
  psVar2[4] = 0;
  (((EnumInfo *)enumName.m_start)->m_name).m_start = (char *)psVar2;
  *psVar2 = enumName.m_size;
  psVar2[1] = (size_type)allValueNames.m_start;
  local_60.super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>._M_head_impl =
       (_Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>)
       (_Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>)enumName.m_start;
  clara::std::
  vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>::
  reserve((vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
           *)(psVar2 + 2),in_R9[1] - *in_R9 >> 2);
  enums.m_size = (size_type)local_38;
  enums.m_start = local_40;
  parseEnums(&local_58,enums);
  piVar3 = (int *)*in_R9;
  piVar1 = (int *)in_R9[1];
  if ((long)local_58.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_58.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl
            .super__Vector_impl_data._M_start >> 4 != (long)piVar1 - (long)piVar3 >> 2) {
    __assert_fail("valueNames.size() == values.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]yacppl/test/3rdparty/Catch2/catch.hpp"
                  ,0x297b,
                  "std::unique_ptr<EnumInfo> Catch::Detail::makeEnumInfo(StringRef, StringRef, const std::vector<int> &)"
                 );
  }
  if (piVar3 != piVar1) {
    lVar4 = 0;
    do {
      local_64 = *piVar3;
      std::vector<std::pair<int,Catch::StringRef>,std::allocator<std::pair<int,Catch::StringRef>>>::
      emplace_back<int&,Catch::StringRef_const&>
                ((vector<std::pair<int,Catch::StringRef>,std::allocator<std::pair<int,Catch::StringRef>>>
                  *)(psVar2 + 2),&local_64,
                 (StringRef *)
                 ((long)&(local_58.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_start + lVar4));
      piVar3 = piVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (piVar3 != piVar1);
  }
  if (local_58.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>)
         local_60.super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>._M_head_impl._M_head_impl;
}

Assistant:

std::unique_ptr<EnumInfo> makeEnumInfo( StringRef enumName, StringRef allValueNames, std::vector<int> const& values ) {
            std::unique_ptr<EnumInfo> enumInfo( new EnumInfo );
            enumInfo->m_name = enumName;
            enumInfo->m_values.reserve( values.size() );

            const auto valueNames = Catch::Detail::parseEnums( allValueNames );
            assert( valueNames.size() == values.size() );
            std::size_t i = 0;
            for( auto value : values )
                enumInfo->m_values.emplace_back(value, valueNames[i++]);

            return enumInfo;
        }